

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

void cft_fasttext_vocab_free(fasttext_vocab_t *vocab)

{
  long *in_RDI;
  size_t i;
  ulong local_10;
  
  if (in_RDI != (long *)0x0) {
    for (local_10 = 0; local_10 < (ulong)in_RDI[2]; local_10 = local_10 + 1) {
      free(*(void **)(*in_RDI + local_10 * 8));
    }
    free((void *)*in_RDI);
    free((void *)in_RDI[1]);
    free(in_RDI);
  }
  return;
}

Assistant:

void cft_fasttext_vocab_free(fasttext_vocab_t* vocab) {
    if (vocab == nullptr) {
        return;
    }
    for (size_t i = 0; i < vocab->length; i++) {
        free(vocab->words[i]);
    }
    free(vocab->words);
    free(vocab->freqs);
    free(vocab);
}